

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_cbs_auth.c
# Opt level: O0

int authentication_start(AUTHENTICATION_HANDLE authentication_handle,CBS_HANDLE cbs_handle)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_2;
  AUTHENTICATION_INSTANCE_conflict *instance;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  CBS_HANDLE cbs_handle_local;
  AUTHENTICATION_HANDLE authentication_handle_local;
  
  if (authentication_handle == (AUTHENTICATION_HANDLE)0x0) {
    l._4_4_ = 0x173;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                ,"authentication_start",0x174,1,
                "authentication_start failed (authentication_handle is NULL)");
    }
  }
  else if (cbs_handle == (CBS_HANDLE)0x0) {
    l._4_4_ = 0x178;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                ,"authentication_start",0x179,1,"authentication_start failed (cbs_handle is NULL)");
    }
  }
  else if (authentication_handle->state == AUTHENTICATION_STATE_STOPPED) {
    authentication_handle->cbs_handle = cbs_handle;
    update_state(authentication_handle,AUTHENTICATION_STATE_STARTING);
    l._4_4_ = 0;
  }
  else {
    l._4_4_ = 0x181;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                ,"authentication_start",0x182,1,
                "authentication_start failed (messenger has already been started; current state: %d)"
                ,authentication_handle->state);
    }
  }
  return l._4_4_;
}

Assistant:

int authentication_start(AUTHENTICATION_HANDLE authentication_handle, const CBS_HANDLE cbs_handle)
{
    int result;

    if (authentication_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("authentication_start failed (authentication_handle is NULL)");
    }
    else if (cbs_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("authentication_start failed (cbs_handle is NULL)");
    }
    else
    {
        AUTHENTICATION_INSTANCE* instance = (AUTHENTICATION_INSTANCE*)authentication_handle;

        if (instance->state != AUTHENTICATION_STATE_STOPPED)
        {
            result = MU_FAILURE;
            LogError("authentication_start failed (messenger has already been started; current state: %d)", instance->state);
        }
        else
        {
            instance->cbs_handle = cbs_handle;

            update_state(instance, AUTHENTICATION_STATE_STARTING);

            result = RESULT_OK;
        }
    }

    return result;
}